

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

EnumDescriptor * __thiscall google::protobuf::FieldDescriptor::enum_type(FieldDescriptor *this)

{
  FieldDescriptor *local_10;
  
  if (this->type_ == '\x0e') {
    if (this->type_once_ != (once_flag *)0x0) {
      local_10 = this;
      absl::lts_20250127::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (this->type_once_,TypeOnceInit,&local_10);
    }
    return (EnumDescriptor *)(this->type_descriptor_).message_type;
  }
  return (EnumDescriptor *)0x0;
}

Assistant:

const EnumDescriptor* FieldDescriptor::enum_type() const {
  if (type_ == TYPE_ENUM) {
    if (type_once_) {
      absl::call_once(*type_once_, FieldDescriptor::TypeOnceInit, this);
    }
    return type_descriptor_.enum_type;
  }
  return nullptr;
}